

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::IntStateGatherReactions
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ChConstraintTwoBodies *pCVar6;
  Scalar *pSVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar5 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    iVar5 = 0;
    if (this->c_x == true) {
      pCVar6 = ChLinkMask::Constr_N(&this->mask,0);
      iVar5 = 1;
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (this->super_ChLinkMate).super_ChLink.react_force.m_data[0];
        auVar8._8_8_ = 0x8000000000000000;
        auVar8._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar9,auVar8);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                            (ulong)off_L);
        SVar1 = (Scalar)vmovlps_avx(auVar8);
        *pSVar7 = SVar1;
      }
    }
    if (this->c_y == true) {
      pCVar6 = ChLinkMask::Constr_N(&this->mask,iVar5);
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (this->super_ChLinkMate).super_ChLink.react_force.m_data[1];
        auVar3._8_8_ = 0x8000000000000000;
        auVar3._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar10,auVar3);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                            (ulong)(iVar5 + off_L));
        SVar1 = (Scalar)vmovlps_avx(auVar8);
        *pSVar7 = SVar1;
      }
      iVar5 = iVar5 + 1;
    }
    if (this->c_z == true) {
      pCVar6 = ChLinkMask::Constr_N(&this->mask,iVar5);
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (this->super_ChLinkMate).super_ChLink.react_force.m_data[2];
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar11,auVar4);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                            (ulong)(iVar5 + off_L));
        SVar1 = (Scalar)vmovlps_avx(auVar8);
        *pSVar7 = SVar1;
      }
      iVar5 = iVar5 + 1;
    }
    if (this->c_rx == true) {
      pCVar6 = ChLinkMask::Constr_N(&this->mask,iVar5);
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        dVar2 = (this->super_ChLinkMate).super_ChLink.react_torque.m_data[0];
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                            (ulong)(iVar5 + off_L));
        *pSVar7 = dVar2 * -2.0;
      }
      iVar5 = iVar5 + 1;
    }
    if (this->c_ry == true) {
      pCVar6 = ChLinkMask::Constr_N(&this->mask,iVar5);
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        dVar2 = (this->super_ChLinkMate).super_ChLink.react_torque.m_data[1];
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                            (ulong)(iVar5 + off_L));
        *pSVar7 = dVar2 * -2.0;
      }
      iVar5 = iVar5 + 1;
    }
    if (this->c_rz == true) {
      pCVar6 = ChLinkMask::Constr_N(&this->mask,iVar5);
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        dVar2 = (this->super_ChLinkMate).super_ChLink.react_torque.m_data[2];
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                            (ulong)(iVar5 + off_L));
        *pSVar7 = dVar2 * -2.0;
      }
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    int nc = 0;
    if (c_x) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -react_force.x();
        nc++;
    }
    if (c_y) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -react_force.y();
        nc++;
    }
    if (c_z) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -react_force.z();
        nc++;
    }
    if (c_rx) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -2.0 * react_torque.x();
        nc++;
    }
    if (c_ry) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -2.0 * react_torque.y();
        nc++;
    }
    if (c_rz) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -2.0 * react_torque.z();
        nc++;
    }
}